

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O1

wchar_t curses_display_menu_core
                  (nh_menuitem_conflict *items,wchar_t icount,char *title,wchar_t how,
                  wchar_t *results,wchar_t x1,wchar_t y1,wchar_t x2,wchar_t y2,
                  _func_nh_bool_win_menu_ptr_wchar_t *changefn,nh_bool start_at_bottom)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  nh_bool nVar7;
  undefined4 uVar8;
  int iVar9;
  wchar_t wVar10;
  int iVar11;
  gamewin *gw;
  WINDOW *pWVar12;
  _func_void_gamewin_ptr *p_Var13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  char cVar17;
  int iVar18;
  wchar_t wVar19;
  code *pcVar20;
  wchar_t wVar21;
  char sbuf [256];
  char local_138 [264];
  
  uVar4 = (ulong)(uint)icount;
  uVar8 = curs_set(0);
  gw = alloc_gamewin(L'\x98');
  gw->draw = draw_menu;
  gw->resize = resize_menu;
  gw[1].resize = (_func_void_gamewin_ptr *)items;
  *(wchar_t *)&gw[1].prev = icount;
  gw[1].next = (gamewin *)title;
  *(wchar_t *)((long)&gw[1].prev + 4) = how;
  pWVar12 = (WINDOW *)calloc((long)icount,1);
  gw[1].win = pWVar12;
  *(wchar_t *)((long)&gw[4].resize + 4) = x1;
  *(wchar_t *)&gw[4].win = y1;
  *(wchar_t *)((long)&gw[4].win + 4) = x2;
  *(wchar_t *)&gw[4].next = y2;
  if (x1 < L'\x01') {
    x1 = L'\0';
  }
  wVar10 = L'\0';
  if (L'\0' < y1) {
    wVar10 = y1;
  }
  if (x2 < L'\0') {
    x2 = _COLS;
  }
  if (y2 < L'\0') {
    y2 = _LINES;
  }
  iVar11 = *(int *)&gw[1].prev;
  if (0 < (long)iVar11) {
    p_Var13 = gw[1].resize;
    cVar17 = 'a';
    lVar16 = 0;
    do {
      if (((p_Var13[lVar16 + 0x108] == (_func_void_gamewin_ptr)0x0) &&
          (*(int *)(p_Var13 + lVar16 + 4) == 1)) && (*(int *)(p_Var13 + lVar16) != 0)) {
        p_Var13[lVar16 + 0x108] = (_func_void_gamewin_ptr)cVar17;
        if (cVar17 == 'z') {
          cVar17 = 'A';
        }
        else if (cVar17 == 'Z') {
          cVar17 = 'a';
        }
        else {
          cVar17 = cVar17 + '\x01';
        }
      }
      lVar16 = lVar16 + 0x10c;
    } while ((long)iVar11 * 0x10c - lVar16 != 0);
  }
  layout_menu(gw);
  if (start_at_bottom != '\0') {
    iVar9 = *(int *)&gw[1].prev - *(int *)((long)&gw[2].resize + 4);
    iVar11 = 0;
    if (0 < iVar9) {
      iVar11 = iVar9;
    }
    *(int *)&gw[2].draw = iVar11;
  }
  iVar11 = *(int *)((long)&gw[2].draw + 4);
  pWVar12 = (WINDOW *)
            newwin(iVar11,*(int *)&gw[2].win,((y2 - wVar10) - iVar11) / 2 + wVar10,
                   ((x2 - x1) - *(int *)&gw[2].win) / 2 + x1);
  gw->win = pWVar12;
  keypad(pWVar12,1);
  nh_box_wborder((WINDOW_conflict *)gw->win,0x600);
  p_Var13 = (_func_void_gamewin_ptr *)
            derwin(gw->win,*(undefined4 *)((long)&gw[2].resize + 4),
                   *(undefined4 *)((long)&gw[2].win + 4),*(int *)&gw[2].resize + -1,2);
  gw[1].draw = p_Var13;
  leaveok(gw->win,1);
  leaveok(gw[1].draw,1);
  bVar5 = false;
  bVar6 = false;
  do {
    draw_menu(gw);
    wVar10 = nh_wgetch(gw->win);
    if (wVar10 < L'^') {
      if (wVar10 < L'.') {
        if (wVar10 < L' ') {
          if (wVar10 == L'\r') {
LAB_0010ced7:
            bVar6 = true;
          }
          else {
            if (wVar10 != L'\x1b') goto LAB_0010cdf6;
            bVar5 = true;
          }
        }
        else if (wVar10 == L' ') {
LAB_0010cdac:
          iVar11 = *(int *)&gw[2].draw;
          iVar9 = *(int *)((long)&gw[2].resize + 4);
          iVar18 = *(int *)&gw[1].prev - iVar9;
          iVar9 = iVar9 + iVar11;
          if (iVar18 <= iVar9) {
            iVar9 = iVar18;
          }
          *(int *)&gw[2].draw = iVar9;
          if ((wVar10 == L' ') && (iVar9 == iVar11)) {
            bVar6 = true;
          }
        }
        else {
          if (wVar10 != L'-') goto LAB_0010cdf6;
          if (L'\0' < icount) {
            uVar15 = 0;
            do {
              *(undefined1 *)((long)((gw[1].win)->_bkgrnd).chars + (uVar15 - 0x5c)) = 0;
              uVar15 = uVar15 + 1;
            } while (uVar4 != uVar15);
          }
        }
      }
      else {
        if (L';' < wVar10) {
          if (wVar10 == L'<') goto LAB_0010cede;
          if (wVar10 == L'>') goto LAB_0010cdac;
          goto LAB_0010cdf6;
        }
        if (wVar10 == L'.') {
          if (*(int *)((long)&gw[1].prev + 4) == 2 && L'\0' < icount) {
            lVar16 = 4;
            uVar15 = 0;
            do {
              if (*(int *)(gw[1].resize + lVar16) == 1) {
                *(undefined1 *)((long)((gw[1].win)->_bkgrnd).chars + (uVar15 - 0x5c)) = 1;
              }
              uVar15 = uVar15 + 1;
              lVar16 = lVar16 + 0x10c;
            } while (uVar4 != uVar15);
          }
        }
        else {
          if (wVar10 != L':') goto LAB_0010cdf6;
          curses_getline("Search:",local_138);
          if (L'\0' < icount) {
            pcVar20 = gw[1].resize + 8;
            uVar15 = 0;
            do {
              pcVar14 = strstr((char *)pcVar20,local_138);
              if (pcVar14 != (char *)0x0) {
                iVar11 = *(int *)&gw[1].prev - *(int *)((long)&gw[2].resize + 4);
                if (iVar11 < 1) {
                  iVar11 = 0;
                }
                if ((int)uVar15 < iVar11) {
                  iVar11 = (int)uVar15;
                }
                *(int *)&gw[2].draw = iVar11;
                break;
              }
              uVar15 = uVar15 + 1;
              pcVar20 = pcVar20 + 0x10c;
            } while (uVar4 != uVar15);
          }
        }
      }
      goto LAB_0010cfdb;
    }
    if (wVar10 < L'Ć') {
      if (wVar10 < L'Ă') {
        if (wVar10 == L'^') goto LAB_0010cec9;
        if (wVar10 == L'|') {
LAB_0010cccf:
          iVar11 = *(int *)&gw[1].prev;
          goto LAB_0010cee3;
        }
        goto LAB_0010cdf6;
      }
      if (wVar10 == L'Ă') {
        if (*(int *)&gw[2].draw < *(int *)&gw[1].prev - *(int *)((long)&gw[2].resize + 4)) {
          iVar11 = *(int *)&gw[2].draw + 1;
LAB_0010ceee:
          *(int *)&gw[2].draw = iVar11;
        }
      }
      else {
        if (wVar10 != L'ă') goto LAB_0010cdf6;
        if (0 < *(int *)&gw[2].draw) {
          iVar11 = *(int *)&gw[2].draw + -1;
          goto LAB_0010ceee;
        }
      }
    }
    else {
      if (wVar10 < L'œ') {
        if (wVar10 == L'Ć') {
LAB_0010cec9:
          *(undefined4 *)&gw[2].draw = 0;
          goto LAB_0010cfdb;
        }
        if (wVar10 == L'Œ') goto LAB_0010cdac;
      }
      else {
        if (wVar10 == L'œ') {
LAB_0010cede:
          iVar11 = *(int *)&gw[2].draw;
LAB_0010cee3:
          iVar11 = iVar11 - *(int *)((long)&gw[2].resize + 4);
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          goto LAB_0010ceee;
        }
        if (wVar10 == L'ŗ') goto LAB_0010ced7;
        if (wVar10 == L'Ũ') goto LAB_0010cccf;
      }
LAB_0010cdf6:
      wVar1 = *(wchar_t *)&gw[1].prev;
      wVar2 = *(wchar_t *)&gw[2].draw;
      wVar3 = *(wchar_t *)((long)&gw[2].resize + 4);
      wVar19 = wVar3 + wVar2;
      if (wVar1 < wVar3 + wVar2) {
        wVar19 = wVar1;
      }
      if (wVar2 < wVar19) {
        p_Var13 = gw[1].resize + (long)wVar2 * 0x10c + 0x108;
        wVar21 = wVar2;
        do {
          if (wVar10 == (char)*p_Var13) goto LAB_0010cf99;
          wVar21 = wVar21 + L'\x01';
          p_Var13 = p_Var13 + 0x10c;
        } while (wVar19 != wVar21);
        if (wVar2 < wVar19) {
          p_Var13 = gw[1].resize + (long)wVar2 * 0x10c + 0x109;
          wVar21 = wVar2;
          do {
            if (wVar10 == (char)*p_Var13) goto LAB_0010cf99;
            wVar21 = wVar21 + L'\x01';
            p_Var13 = p_Var13 + 0x10c;
          } while (wVar19 != wVar21);
        }
      }
      wVar21 = L'\xffffffff';
      if (L'\0' < wVar1 && wVar3 < wVar1) {
        pcVar20 = gw[1].resize + 0x108;
        lVar16 = 0;
        do {
          if (wVar10 == (char)*pcVar20) {
            iVar11 = (int)lVar16;
            wVar21 = -iVar11;
            wVar10 = L'\x01' - (wVar3 + iVar11);
            if (SBORROW4(wVar2,wVar21) == wVar2 + iVar11 < 0) {
              wVar10 = wVar21;
            }
            *(wchar_t *)&gw[2].draw = wVar10;
            break;
          }
          lVar16 = lVar16 + -1;
          pcVar20 = pcVar20 + 0x10c;
        } while (-lVar16 != (ulong)(uint)wVar1);
      }
LAB_0010cf99:
      if (((wVar21 != L'\xffffffff') &&
          ((changefn == (_func_nh_bool_win_menu_ptr_wchar_t *)0x0 ||
           (nVar7 = (*changefn)((win_menu *)(gw + 1),wVar21), nVar7 != '\0')))) &&
         (*(bool *)((long)((gw[1].win)->_bkgrnd).chars + (long)wVar21 + -0x5c) =
               *(char *)((long)((gw[1].win)->_bkgrnd).chars + (long)wVar21 + -0x5c) == '\0',
         *(int *)((long)&gw[1].prev + 4) == 1)) {
        bVar6 = true;
      }
    }
LAB_0010cfdb:
    if (bVar6 || bVar5) {
      delwin(gw[1].draw);
      delwin(gw->win);
      wVar10 = L'\xffffffff';
      if (!bVar5) {
        if (icount < L'\x01') {
          wVar10 = L'\0';
        }
        else {
          pWVar12 = gw[1].win;
          uVar15 = 0;
          wVar10 = L'\0';
          do {
            if (*(char *)((long)(pWVar12->_bkgrnd).chars + (uVar15 - 0x5c)) != '\0') {
              if (results != (wchar_t *)0x0) {
                results[wVar10] = items->id;
              }
              wVar10 = wVar10 + L'\x01';
            }
            uVar15 = uVar15 + 1;
            items = items + 1;
          } while (uVar4 != uVar15);
        }
      }
      free(gw[1].win);
      delete_gamewin(gw);
      redraw_game_windows();
      curs_set(uVar8);
      return wVar10;
    }
  } while( true );
}

Assistant:

int curses_display_menu_core(struct nh_menuitem *items, int icount,
			     const char *title, int how, int *results,
			     int x1, int y1, int x2, int y2,
			     nh_bool (*changefn)(struct win_menu*, int),
			     nh_bool start_at_bottom)
{
    struct gamewin *gw;
    struct win_menu *mdat;
    int i, key, idx, rv, startx, starty, prevcurs, prev_offset;
    nh_bool done, cancelled;
    char sbuf[BUFSZ];
    
    prevcurs = curs_set(0);
    
    gw = alloc_gamewin(sizeof(struct win_menu));
    gw->draw = draw_menu;
    gw->resize = resize_menu;
    mdat = (struct win_menu*)gw->extra;
    mdat->items = items;
    mdat->icount = icount;
    mdat->title = title;
    mdat->how = how;
    mdat->selected = calloc(icount, sizeof(nh_bool));
    mdat->x1 = x1; mdat->y1 = y1; mdat->x2 = x2; mdat->y2 = y2;
    
    if (x1 < 0) x1 = 0;
    if (y1 < 0) y1 = 0;
    if (x2 < 0) x2 = COLS;
    if (y2 < 0) y2 = LINES;
    
    assign_menu_accelerators(mdat);
    layout_menu(gw);

    if (start_at_bottom)
	mdat->offset = max(mdat->icount - mdat->innerheight, 0);

    starty = (y2 - y1 - mdat->height) / 2 + y1;
    startx = (x2 - x1 - mdat->width) / 2 + x1;
    
    gw->win = newwin(mdat->height, mdat->width, starty, startx);
    keypad(gw->win, TRUE);
    nh_box_wborder(gw->win, FRAME_ATTRS);
    mdat->content = derwin(gw->win, mdat->innerheight, mdat->innerwidth,
			   mdat->frameheight-1, 2);
    leaveok(gw->win, TRUE);
    leaveok(mdat->content, TRUE);
    done = FALSE;
    cancelled = FALSE;
    while (!done && !cancelled) {
	draw_menu(gw);
	
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    /* one line up */
	    case KEY_UP:
		if (mdat->offset > 0)
		    mdat->offset--;
		break;
		
	    /* one line down */
	    case KEY_DOWN:
		if (mdat->offset < mdat->icount - mdat->innerheight)
		    mdat->offset++;
		break;
	    
	    /* page up */
	    case KEY_PPAGE:
	    case '<':
		mdat->offset -= mdat->innerheight;
		if (mdat->offset < 0)
		    mdat->offset = 0;
		break;
	    
	    /* page down */
	    case KEY_NPAGE:
	    case '>':
	    case ' ':
		prev_offset = mdat->offset;
		mdat->offset += mdat->innerheight;
		if (mdat->offset > mdat->icount - mdat->innerheight)
		    mdat->offset = mdat->icount - mdat->innerheight;
		if (key == ' ' && mdat->offset == prev_offset)
		    done = TRUE;
		break;
		
	    /* go to the top */
	    case KEY_HOME:
	    case '^':
		mdat->offset = 0;
		break;
		
	    /* go to the end */
	    case KEY_END:
	    case '|':
		mdat->offset = max(mdat->icount - mdat->innerheight, 0);
		break;
		
	    /* cancel */
	    case KEY_ESC:
		cancelled = TRUE;
		break;
		
	    /* confirm */
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;
		
	    /* select all */
	    case '.':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].role == MI_NORMAL)
			    mdat->selected[i] = TRUE;
		break;
		
	    /* select none */
	    case '-':
		for (i = 0; i < icount; i++)
		    mdat->selected[i] = FALSE;
		break;
		
	    /* search for a menu item */
	    case ':':
		curses_getline("Search:", sbuf);
		for (i = 0; i < icount; i++)
		    if (strstr(mdat->items[i].caption, sbuf))
			break;
		if (i < icount) {
		    int end = max(mdat->icount - mdat->innerheight, 0);
		    mdat->offset = min(i, end);
		}
		break;
		
	    /* try to find an item for this key and, if one is found, select it */
	    default:
		idx = find_accel(key, mdat);
		
		if (idx != -1 && /* valid accelerator */
		    (!changefn || changefn(mdat, idx))) {
		    mdat->selected[idx] = !mdat->selected[idx];
		    
		    if (mdat->how == PICK_ONE)
			done = TRUE;
		}
		break;
	}
    }
    
    delwin(mdat->content);
    delwin(gw->win);
    
    if (cancelled)
	rv = -1;
    else {
	rv = 0;
	for (i = 0; i < icount; i++) {
	    if (mdat->selected[i]) {
		if (results)
		    results[rv] = items[i].id;
		rv++;
	    }
	}
    }
    
    free(mdat->selected);
    delete_gamewin(gw);    
    redraw_game_windows();
    curs_set(prevcurs);
	
    return rv;
}